

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O3

int link_attach(LINK_HANDLE link,ON_TRANSFER_RECEIVED on_transfer_received,
               ON_LINK_STATE_CHANGED on_link_state_changed,ON_LINK_FLOW_ON on_link_flow_on,
               void *callback_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (link == (LINK_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x495;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x495;
    }
    pcVar4 = "NULL link";
    iVar3 = 0x494;
  }
  else if (link->is_closed == true) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x49a;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x49a;
    }
    pcVar4 = "Already attached";
    iVar3 = 0x499;
  }
  else {
    if (link->is_underlying_session_begun != false) {
      return 0;
    }
    link->on_link_state_changed = on_link_state_changed;
    link->on_transfer_received = on_transfer_received;
    link->on_link_flow_on = on_link_flow_on;
    link->callback_context = callback_context;
    iVar1 = session_begin(link->session);
    if (iVar1 == 0) {
      link->is_underlying_session_begun = true;
      iVar1 = session_start_link_endpoint
                        (link->link_endpoint,link_frame_received,on_session_state_changed,
                         on_session_flow_on,link);
      if (iVar1 == 0) {
        link->received_payload_size = 0;
        return 0;
      }
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x4b1;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0x4b1;
      }
      pcVar4 = "Binding link endpoint to session failed";
      iVar3 = 0x4b0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x4a8;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0x4a8;
      }
      pcVar4 = "Begin session failed";
      iVar3 = 0x4a7;
    }
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
            ,"link_attach",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

int link_attach(LINK_HANDLE link, ON_TRANSFER_RECEIVED on_transfer_received, ON_LINK_STATE_CHANGED on_link_state_changed, ON_LINK_FLOW_ON on_link_flow_on, void* callback_context)
{
    int result;

    if (link == NULL)
    {
        LogError("NULL link");
        result = MU_FAILURE;
    }
    else if (link->is_closed)
    {
        LogError("Already attached");
        result = MU_FAILURE;
    }
    else
    {
        if (!link->is_underlying_session_begun)
        {
            link->on_link_state_changed = on_link_state_changed;
            link->on_transfer_received = on_transfer_received;
            link->on_link_flow_on = on_link_flow_on;
            link->callback_context = callback_context;

            if (session_begin(link->session) != 0)
            {
                LogError("Begin session failed");
                result = MU_FAILURE;
            }
            else
            {
                link->is_underlying_session_begun = true;

                if (session_start_link_endpoint(link->link_endpoint, link_frame_received, on_session_state_changed, on_session_flow_on, link) != 0)
                {
                    LogError("Binding link endpoint to session failed");
                    result = MU_FAILURE;
                }
                else
                {
                    link->received_payload_size = 0;

                    result = 0;
                }
            }
        }
        else
        {
            result = 0;
        }
    }

    return result;
}